

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void uninitialize_all_placeholders(Am_Object *execute_command)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value local_50;
  Am_Object local_40;
  Am_Object ph;
  Am_Assoc local_28;
  Am_Assoc as;
  Am_Value_List ph_list;
  Am_Object *execute_command_local;
  
  pAVar2 = Am_Object::Get(execute_command,Am_PLACEHOLDER_LIST,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)&as,pAVar2);
  Am_Assoc::Am_Assoc(&local_28);
  Am_Object::Am_Object(&local_40);
  Am_Value_List::Start((Am_Value_List *)&as);
  while( true ) {
    bVar1 = Am_Value_List::Last((Am_Value_List *)&as);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pAVar2 = Am_Value_List::Get((Am_Value_List *)&as);
    Am_Assoc::operator=(&local_28,pAVar2);
    Am_Assoc::Value_2((Am_Assoc *)&local_50);
    Am_Object::operator=(&local_40,&local_50);
    Am_Value::~Am_Value(&local_50);
    Am_Object::Set(&local_40,Am_PLACEHOLDER_INITIALIZED,false,1);
    Am_Value_List::Next((Am_Value_List *)&as);
  }
  Am_Object::~Am_Object(&local_40);
  Am_Assoc::~Am_Assoc(&local_28);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&as);
  return;
}

Assistant:

void
uninitialize_all_placeholders(Am_Object &execute_command)
{
  Am_Value_List ph_list = execute_command.Get(Am_PLACEHOLDER_LIST);
  Am_Assoc as;
  Am_Object ph;
  for (ph_list.Start(); !ph_list.Last(); ph_list.Next()) {
    as = ph_list.Get();
    ph = as.Value_2();
    ph.Set(Am_PLACEHOLDER_INITIALIZED, false, Am_OK_IF_NOT_THERE);
  }
}